

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

xmlNodePtr xmlSAX2TextNode(xmlParserCtxtPtr ctxt,xmlChar *str,int len)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  int local_4c;
  int i;
  xmlChar *tmp;
  xmlChar *pxStack_38;
  xmlChar cur;
  xmlChar *intern;
  xmlNodePtr ret;
  int len_local;
  xmlChar *str_local;
  xmlParserCtxtPtr ctxt_local;
  
  pxStack_38 = (xmlChar *)0x0;
  if (ctxt->freeElems == (xmlNodePtr)0x0) {
    intern = (xmlChar *)(*xmlMalloc)(0x78);
  }
  else {
    intern = (xmlChar *)ctxt->freeElems;
    ctxt->freeElems = ((xmlNodePtr)intern)->next;
    ctxt->freeElemsNr = ctxt->freeElemsNr + -1;
  }
  if (intern == (xmlChar *)0x0) {
    xmlErrMemory(ctxt,"xmlSAX2Characters");
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    memset(intern,0,0x78);
    if (ctxt->dictNames != 0) {
      xVar1 = str[len];
      if ((len < 0x10) && ((ctxt->options & 0x10000U) != 0)) {
        pxStack_38 = intern + 0x58;
        memcpy(pxStack_38,str,(long)len);
        pxStack_38[len] = '\0';
      }
      else if ((len < 4) &&
              (((xVar1 == '\"' || (xVar1 == '\'')) || ((xVar1 == '<' && (str[len + 1] != '!')))))) {
        pxStack_38 = xmlDictLookup(ctxt->dict,str,len);
      }
      else if (((*str == ' ') || (((8 < *str && (*str < 0xb)) || (*str == '\r')))) &&
              (((len < 0x3c && (xVar1 == '<')) && (str[len + 1] != '!')))) {
        for (local_4c = 1; local_4c < len; local_4c = local_4c + 1) {
          if (((str[local_4c] != ' ') && ((str[local_4c] < 9 || (10 < str[local_4c])))) &&
             (str[local_4c] != '\r')) goto LAB_001bbe9e;
        }
        pxStack_38 = xmlDictLookup(ctxt->dict,str,len);
      }
    }
LAB_001bbe9e:
    intern[8] = '\x03';
    intern[9] = '\0';
    intern[10] = '\0';
    intern[0xb] = '\0';
    *(xmlChar **)(intern + 0x10) = "text";
    if (pxStack_38 == (xmlChar *)0x0) {
      pxVar2 = xmlStrndup(str,len);
      *(xmlChar **)(intern + 0x50) = pxVar2;
      if (*(long *)(intern + 0x50) == 0) {
        xmlSAX2ErrMemory(ctxt,"xmlSAX2TextNode");
        (*xmlFree)(intern);
        return (xmlNodePtr)0x0;
      }
    }
    else {
      *(xmlChar **)(intern + 0x50) = pxStack_38;
    }
    if ((ctxt->linenumbers != 0) && (ctxt->input != (xmlParserInputPtr)0x0)) {
      if (ctxt->input->line < 0xffff) {
        *(short *)(intern + 0x70) = (short)ctxt->input->line;
      }
      else {
        intern[0x70] = 0xff;
        intern[0x71] = 0xff;
        if ((ctxt->options & 0x400000U) != 0) {
          *(long *)(intern + 0x68) = (long)ctxt->input->line;
        }
      }
    }
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var3 = __xmlRegisterNodeDefaultValue(), *pp_Var3 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var3 = __xmlRegisterNodeDefaultValue();
      (**pp_Var3)((xmlNodePtr)intern);
    }
    ctxt_local = (xmlParserCtxtPtr)intern;
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

static xmlNodePtr
xmlSAX2TextNode(xmlParserCtxtPtr ctxt, const xmlChar *str, int len) {
    xmlNodePtr ret;
    const xmlChar *intern = NULL;

    /*
     * Allocate
     */
    if (ctxt->freeElems != NULL) {
	ret = ctxt->freeElems;
	ctxt->freeElems = ret->next;
	ctxt->freeElemsNr--;
    } else {
	ret = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    }
    if (ret == NULL) {
        xmlErrMemory(ctxt, "xmlSAX2Characters");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlNode));
    /*
     * intern the formatting blanks found between tags, or the
     * very short strings
     */
    if (ctxt->dictNames) {
        xmlChar cur = str[len];

	if ((len < (int) (2 * sizeof(void *))) &&
	    (ctxt->options & XML_PARSE_COMPACT)) {
	    /* store the string in the node overriding properties and nsDef */
	    xmlChar *tmp = (xmlChar *) &(ret->properties);
	    memcpy(tmp, str, len);
	    tmp[len] = 0;
	    intern = tmp;
	} else if ((len <= 3) && ((cur == '"') || (cur == '\'') ||
	    ((cur == '<') && (str[len + 1] != '!')))) {
	    intern = xmlDictLookup(ctxt->dict, str, len);
	} else if (IS_BLANK_CH(*str) && (len < 60) && (cur == '<') &&
	           (str[len + 1] != '!')) {
	    int i;

	    for (i = 1;i < len;i++) {
		if (!IS_BLANK_CH(str[i])) goto skip;
	    }
	    intern = xmlDictLookup(ctxt->dict, str, len);
	}
    }
skip:
    ret->type = XML_TEXT_NODE;

    ret->name = xmlStringText;
    if (intern == NULL) {
	ret->content = xmlStrndup(str, len);
	if (ret->content == NULL) {
	    xmlSAX2ErrMemory(ctxt, "xmlSAX2TextNode");
	    xmlFree(ret);
	    return(NULL);
	}
    } else
	ret->content = (xmlChar *) intern;

    if (ctxt->linenumbers) {
	if (ctxt->input != NULL) {
	    if (ctxt->input->line < 65535)
		ret->line = (short) ctxt->input->line;
	    else {
	        ret->line = 65535;
		if (ctxt->options & XML_PARSE_BIG_LINES)
		    ret->psvi = (void *) (ptrdiff_t) ctxt->input->line;
	    }
	}
    }

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(ret);
    return(ret);
}